

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O0

int luaopen_debugchannel(lua_State *L)

{
  undefined1 local_68 [8];
  luaL_Reg l [5];
  lua_State *L_local;
  
  memcpy(local_68,&DAT_00184a60,0x50);
  luaL_checkversion_(L,503.0,0x88);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,4);
  luaL_setfuncs(L,(luaL_Reg *)local_68,0);
  return 1;
}

Assistant:

int
luaopen_debugchannel(lua_State *L) {
	luaL_Reg l[] = {
		{ "create", lcreate },	// for write
		{ "connect", lconnect },	// for read
		{ "release", lrelease },
		{ "sethook", db_sethook },
		{ NULL, NULL },
	};
	luaL_checkversion(L);
	luaL_newlib(L,l);
	return 1;
}